

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.h
# Opt level: O0

string * __thiscall
cmExtraCodeLiteGenerator::GetName_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this)

{
  cmExtraCodeLiteGenerator *this_local;
  
  GetActualName_abi_cxx11_();
  return __return_storage_ptr__;
}

Assistant:

virtual std::string GetName() const
                          { return cmExtraCodeLiteGenerator::GetActualName();}